

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatRead.c
# Opt level: O0

int Msat_SolverParseDimacs(FILE *pFile,Msat_Solver_t **p,int fVerbose)

{
  int iVar1;
  char *pText_00;
  int Value;
  char *pText;
  int fVerbose_local;
  Msat_Solver_t **p_local;
  FILE *pFile_local;
  
  pText_00 = Msat_FileRead(pFile);
  iVar1 = Msat_ReadDimacs(pText_00,p,fVerbose);
  if (pText_00 != (char *)0x0) {
    free(pText_00);
  }
  return iVar1;
}

Assistant:

int  Msat_SolverParseDimacs( FILE * pFile, Msat_Solver_t ** p, int fVerbose )
{
    char * pText;
    int  Value;
    pText = Msat_FileRead( pFile );
    Value = Msat_ReadDimacs( pText, p, fVerbose );
    ABC_FREE( pText );
    return Value;
}